

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O0

int main(void)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  UserData data_00;
  undefined8 uVar4;
  void *kmem_00;
  N_Vector p_Var5;
  undefined8 uVar6;
  SUNContext sunctx;
  SUNLinearSolver LS;
  void *kmem;
  int maxlrst;
  int maxl;
  int flag;
  UserData data;
  N_Vector constraints;
  N_Vector sc;
  N_Vector cc;
  sunrealtype scsteptol;
  sunrealtype fnormtol;
  int linsolver;
  int globalstrategy;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  UserData in_stack_ffffffffffffff90;
  void *flagvalue;
  N_Vector cc_00;
  undefined1 local_58 [4];
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  uint local_c;
  int local_4;
  
  flagvalue = (void *)0x0;
  SUNContext_Create(0,&stack0xffffffffffffff98);
  _local_58 = 0;
  cc_00 = (N_Vector)0x0;
  data_00 = AllocUserData();
  iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  if (iVar3 == 0) {
    InitUserData(data_00);
    uVar4 = N_VNew_Serial(0x96,flagvalue);
    iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    if (iVar3 == 0) {
      kmem_00 = (void *)N_VNew_Serial(0x96,flagvalue);
      iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      if (iVar3 == 0) {
        p_Var5 = (N_Vector)N_VNew_Serial(0x96,flagvalue);
        data_00->rates = p_Var5;
        iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
        if (iVar3 == 0) {
          uVar6 = N_VNew_Serial(0x96,flagvalue);
          iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
          if (iVar3 == 0) {
            N_VConst(0x4000000000000000,uVar6);
            for (local_c = 0; (int)local_c < 4; local_c = local_c + 1) {
              SetInitialProfiles((N_Vector)in_stack_ffffffffffffff90,
                                 (N_Vector)
                                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
              _local_58 = KINCreate(flagvalue);
              iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff8c);
              if (iVar3 != 0) {
                return 1;
              }
              KINInit(_local_58,func,uVar4);
              iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff8c);
              if (iVar3 != 0) {
                return 1;
              }
              KINSetUserData(_local_58,data_00);
              iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff8c);
              if (iVar3 != 0) {
                return 1;
              }
              KINSetConstraints(_local_58,uVar6);
              iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff8c);
              if (iVar3 != 0) {
                return 1;
              }
              KINSetFuncNormTol(0x3e7ad7f29abcaf48,_local_58);
              iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff8c);
              if (iVar3 != 0) {
                return 1;
              }
              KINSetScaledStepTol(0x3d3c25c268497682,_local_58);
              iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff8c);
              if (iVar3 != 0) {
                return 1;
              }
              in_stack_ffffffffffffff90 = (UserData)(ulong)local_c;
              switch(in_stack_ffffffffffffff90) {
              case (UserData)0x0:
                printf(" -------");
                printf(" \n| SPGMR |\n");
                printf(" -------\n");
                cc_00 = (N_Vector)SUNLinSol_SPGMR(uVar4,2,0xf,flagvalue);
                iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c);
                if (iVar3 != 0) {
                  return 1;
                }
                KINSetLinearSolver(_local_58,cc_00,0);
                iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c);
                if (iVar3 != 0) {
                  return 1;
                }
                in_stack_ffffffffffffffb4 = 2;
                SUNLinSol_SPGMRSetMaxRestarts(cc_00,2);
                iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c);
                if (iVar3 != 0) {
                  return 1;
                }
                break;
              case (UserData)0x1:
                printf(" --------");
                printf(" \n| SPBCGS |\n");
                printf(" --------\n");
                cc_00 = (N_Vector)SUNLinSol_SPBCGS(uVar4,2,0xf,flagvalue);
                iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c);
                if (iVar3 != 0) {
                  return 1;
                }
                KINSetLinearSolver(_local_58,cc_00,0);
                iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c);
                if (iVar3 != 0) {
                  return 1;
                }
                break;
              case (UserData)0x2:
                printf(" ---------");
                printf(" \n| SPTFQMR |\n");
                printf(" ---------\n");
                cc_00 = (N_Vector)SUNLinSol_SPTFQMR(uVar4,2,0x19,flagvalue);
                iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c);
                if (iVar3 != 0) {
                  return 1;
                }
                KINSetLinearSolver(_local_58,cc_00,0);
                iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c);
                if (iVar3 != 0) {
                  return 1;
                }
                break;
              case (UserData)0x3:
                printf(" -------");
                printf(" \n| SPFGMR |\n");
                printf(" -------\n");
                cc_00 = (N_Vector)SUNLinSol_SPFGMR(uVar4,2,0xf,flagvalue);
                iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c);
                if (iVar3 != 0) {
                  return 1;
                }
                KINSetLinearSolver(_local_58,cc_00,0);
                iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c);
                if (iVar3 != 0) {
                  return 1;
                }
                in_stack_ffffffffffffffb4 = 2;
                SUNLinSol_SPGMRSetMaxRestarts(cc_00,2);
                iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                   in_stack_ffffffffffffff8c);
                if (iVar3 != 0) {
                  return 1;
                }
              }
              KINSetPreconditioner(_local_58,PrecSetupBD,PrecSolveBD);
              iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff8c);
              uVar2 = _local_58;
              if (iVar3 != 0) {
                return 1;
              }
              uVar1 = (ulong)_local_58 >> 0x20;
              iVar3 = (int)uVar1;
              _local_58 = uVar2;
              PrintHeader(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,iVar3,
                          (sunrealtype)cc_00,(sunrealtype)flagvalue,
                          (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
              KINSol(_local_58,uVar4,0,kmem_00,kmem_00);
              iVar3 = check_flag(flagvalue,(char *)in_stack_ffffffffffffff90,
                                 in_stack_ffffffffffffff8c);
              if (iVar3 != 0) {
                return 1;
              }
              printf("\n\nComputed equilibrium species concentrations:\n");
              PrintOutput(cc_00);
              PrintFinalStats(kmem_00,(int)((ulong)uVar6 >> 0x20));
              KINFree(local_58);
              SUNLinSolFree(cc_00);
            }
            N_VDestroy(uVar6);
            N_VDestroy(uVar4);
            N_VDestroy(kmem_00);
            FreeUserData(in_stack_ffffffffffffff90);
            SUNContext_Free(&stack0xffffffffffffff98);
            local_4 = 0;
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  int globalstrategy, linsolver;
  sunrealtype fnormtol, scsteptol;
  N_Vector cc, sc, constraints;
  UserData data;
  int flag, maxl, maxlrst;
  void* kmem;
  SUNLinearSolver LS;

  /* Create the SUNDIALS context object for this simulation. */
  SUNContext sunctx = NULL;
  SUNContext_Create(SUN_COMM_NULL, &sunctx);

  cc = sc = constraints = NULL;
  kmem                  = NULL;
  LS                    = NULL;
  data                  = NULL;

  /* Allocate memory, and set problem data, initial values, tolerances */
  globalstrategy = KIN_NONE;

  data = AllocUserData();
  if (check_flag((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data);

  /* Create serial vectors of length NEQ */
  cc = N_VNew_Serial(NEQ, sunctx);
  if (check_flag((void*)cc, "N_VNew_Serial", 0)) { return (1); }
  sc = N_VNew_Serial(NEQ, sunctx);
  if (check_flag((void*)sc, "N_VNew_Serial", 0)) { return (1); }
  data->rates = N_VNew_Serial(NEQ, sunctx);
  if (check_flag((void*)data->rates, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VNew_Serial(NEQ, sunctx);
  if (check_flag((void*)constraints, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(TWO, constraints);

  fnormtol  = FTOL;
  scsteptol = STOL;

  /* START: Loop through SPGMR, SPBCGS, SPTFQMR and SPFGMR linear solver modules */
  for (linsolver = 0; linsolver < 4; ++linsolver)
  {
    /* (Re-)Initialize user data */
    SetInitialProfiles(cc, sc);

    /* Call KINCreate/KINInit to initialize KINSOL:
       A pointer to KINSOL problem memory is returned and stored in kmem. */
    kmem = KINCreate(sunctx);
    if (check_flag((void*)kmem, "KINCreate", 0)) { return (1); }

    /* Vector cc passed as template vector. */
    flag = KINInit(kmem, func, cc);
    if (check_flag(&flag, "KINInit", 1)) { return (1); }

    flag = KINSetUserData(kmem, data);
    if (check_flag(&flag, "KINSetUserData", 1)) { return (1); }
    flag = KINSetConstraints(kmem, constraints);
    if (check_flag(&flag, "KINSetConstraints", 1)) { return (1); }
    flag = KINSetFuncNormTol(kmem, fnormtol);
    if (check_flag(&flag, "KINSetFuncNormTol", 1)) { return (1); }
    flag = KINSetScaledStepTol(kmem, scsteptol);
    if (check_flag(&flag, "KINSetScaledStepTol", 1)) { return (1); }

    /* Attach a linear solver module */
    switch (linsolver)
    {
    /* (a) SPGMR */
    case (USE_SPGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPGMR |\n");
      printf(" -------\n");

      /* Create SUNLinSol_SPGMR object with right preconditioning and the
         maximum Krylov dimension maxl */
      maxl = 15;
      LS   = SUNLinSol_SPGMR(cc, SUN_PREC_RIGHT, maxl, sunctx);
      if (check_flag((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

      /* Attach the linear solver to KINSOL */
      flag = KINSetLinearSolver(kmem, LS, NULL);
      if (check_flag(&flag, "KINSetLinearSolver", 1)) { return 1; }

      /* Set the maximum number of restarts */
      maxlrst = 2;
      flag    = SUNLinSol_SPGMRSetMaxRestarts(LS, maxlrst);
      if (check_flag(&flag, "SUNLinSol_SPGMRSetMaxRestarts", 1)) { return (1); }

      break;

    /* (b) SPBCGS */
    case (USE_SPBCGS):

      /* Print header */
      printf(" --------");
      printf(" \n| SPBCGS |\n");
      printf(" --------\n");

      /* Create SUNLinSol_SPBCGS object with right preconditioning and the
         maximum Krylov dimension maxl */
      maxl = 15;
      LS   = SUNLinSol_SPBCGS(cc, SUN_PREC_RIGHT, maxl, sunctx);
      if (check_flag((void*)LS, "SUNLinSol_SPBCGS", 0)) { return (1); }

      /* Attach the linear solver to KINSOL */
      flag = KINSetLinearSolver(kmem, LS, NULL);
      if (check_flag(&flag, "KINSetLinearSolver", 1)) { return 1; }

      break;

    /* (c) SPTFQMR */
    case (USE_SPTFQMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPTFQMR |\n");
      printf(" ---------\n");

      /* Create SUNLinSol_SPTFQMR object with right preconditioning and the
         maximum Krylov dimension maxl */
      maxl = 25;
      LS   = SUNLinSol_SPTFQMR(cc, SUN_PREC_RIGHT, maxl, sunctx);
      if (check_flag((void*)LS, "SUNLinSol_SPTFQMR", 0)) { return (1); }

      /* Attach the linear solver to KINSOL */
      flag = KINSetLinearSolver(kmem, LS, NULL);
      if (check_flag(&flag, "KINSetLinearSolver", 1)) { return 1; }

      break;

    /* (d) SPFGMR */
    case (USE_SPFGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPFGMR |\n");
      printf(" -------\n");

      /* Create SUNLinSol_SPFGMR object with right preconditioning and the
         maximum Krylov dimension maxl */
      maxl = 15;
      LS   = SUNLinSol_SPFGMR(cc, SUN_PREC_RIGHT, maxl, sunctx);
      if (check_flag((void*)LS, "SUNLinSol_SPFGMR", 0)) { return (1); }

      /* Attach the linear solver to KINSOL */
      flag = KINSetLinearSolver(kmem, LS, NULL);
      if (check_flag(&flag, "KINSetLinearSolver", 1)) { return 1; }

      /* Set the maximum number of restarts */
      maxlrst = 2;
      flag    = SUNLinSol_SPGMRSetMaxRestarts(LS, maxlrst);
      if (check_flag(&flag, "SUNLinSol_SPGMRSetMaxRestarts", 1)) { return (1); }

      break;
    }

    /* Set preconditioner functions */
    flag = KINSetPreconditioner(kmem, PrecSetupBD, PrecSolveBD);
    if (check_flag(&flag, "KINSetPreconditioner", 1)) { return (1); }

    /* Print out the problem size, solution parameters, initial guess. */
    PrintHeader(globalstrategy, maxl, maxlrst, fnormtol, scsteptol, linsolver);

    /* Call KINSol and print output concentration profile */
    flag = KINSol(kmem,           /* KINSol memory block */
                  cc,             /* initial guess on input; solution vector */
                  globalstrategy, /* global strategy choice */
                  sc,             /* scaling vector, for the variable cc */
                  sc);            /* scaling vector for function values fval */
    if (check_flag(&flag, "KINSol", 1)) { return (1); }

    printf("\n\nComputed equilibrium species concentrations:\n");
    PrintOutput(cc);

    /* Print final statistics and free memory */
    PrintFinalStats(kmem, linsolver);

    KINFree(&kmem);
    SUNLinSolFree(LS);

  } /* END: Loop through SPGMR, SPBCGS, SPTFQMR, and SPFGMR linear solver modules */

  N_VDestroy(constraints);
  N_VDestroy(cc);
  N_VDestroy(sc);
  FreeUserData(data);

  SUNContext_Free(&sunctx);
  return (0);
}